

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-encoder.c
# Opt level: O0

int mg_session_write_float(mg_session *session,double value)

{
  uint64_t in_XMM0_Qa;
  uint64_t as_uint64;
  int status;
  undefined8 in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 local_4;
  
  local_4 = mg_session_write_uint8
                      ((mg_session *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       (uint8_t)((ulong)in_stack_ffffffffffffffd8 >> 0x38));
  if (local_4 == 0) {
    local_4 = mg_session_write_uint64((mg_session *)(ulong)in_stack_ffffffffffffffe0,in_XMM0_Qa);
  }
  return local_4;
}

Assistant:

int mg_session_write_float(mg_session *session, double value) {
  MG_RETURN_IF_FAILED(mg_session_write_uint8(session, MG_MARKER_FLOAT));
  uint64_t as_uint64;
  memcpy(&as_uint64, &value, sizeof(value));
  return mg_session_write_uint64(session, as_uint64);
}